

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::openLogFile(Highs *this,string *log_file)

{
  string *in_RSI;
  string *in_stack_00000040;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  highsOpenLogFile((HighsLogOptions *)this,
                   (vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)log_file,
                   in_stack_00000040);
  std::__cxx11::string::~string(local_30);
  return kOk;
}

Assistant:

HighsStatus Highs::openLogFile(const std::string& log_file) {
  highsOpenLogFile(options_.log_options, options_.records, log_file);
  return HighsStatus::kOk;
}